

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O3

bool __thiscall FZipFile::Open(FZipFile *this,bool quiet)

{
  undefined8 *puVar1;
  ushort uVar2;
  FileReader *pFVar3;
  FZipFile *this_00;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  ulong *puVar7;
  void *__ptr;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *format;
  size_t __size;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  FZipLump *this_01;
  FString name;
  FZipEndOfCentralDirectory info;
  int local_46c;
  FString local_460;
  void *local_458;
  void *local_450;
  FZipFile *local_448;
  FString local_440;
  char local_438 [4];
  short local_434;
  short local_432;
  ushort local_430;
  ushort local_42e;
  int local_42c;
  uint local_428;
  
  pFVar3 = (this->super_FResourceFile).Reader;
  local_448 = this;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,2);
  uVar4 = (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[3])(pFVar3);
  uVar14 = 0xffff;
  if (uVar4 < 0xffff) {
    uVar14 = uVar4;
  }
  if (4 < uVar4) {
    local_458 = (void *)CONCAT44(local_458._4_4_,uVar4 - 4);
    uVar12 = 4;
    while( true ) {
      uVar11 = uVar12 + 0x400;
      uVar12 = uVar14;
      if (uVar11 < uVar14) {
        uVar12 = uVar11;
      }
      uVar16 = 0x404;
      if (uVar12 < 0x404) {
        uVar16 = (ulong)uVar12;
      }
      iVar5 = (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])
                        (pFVar3,(ulong)(uVar4 - uVar12),0);
      if (CONCAT44(extraout_var,iVar5) != 0) break;
      iVar15 = (int)uVar16;
      iVar5 = (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_438,uVar16);
      this_00 = local_448;
      if (CONCAT44(extraout_var_00,iVar5) != uVar16) break;
      uVar10 = (ulong)(iVar15 - 3);
      lVar6 = 0;
      uVar16 = uVar10;
      do {
        if ((((local_438[lVar6 + (ulong)(iVar15 - 4)] == 'P') && (local_438[lVar6 + uVar10] == 'K'))
            && (local_438[lVar6 + uVar10 + 1] == '\x05')) &&
           (local_438[lVar6 + uVar10 + 2] == '\x06')) {
          if ((int)lVar6 + ((iVar15 + (int)local_458) - uVar12) != 0) {
            local_448->Lumps = (FZipLump *)0x0;
            if (uVar4 <= uVar11) {
              uVar11 = uVar4;
            }
            uVar14 = 0x404;
            if (uVar11 < 0x404) {
              uVar14 = uVar11;
            }
            if (0xfffe < uVar11) {
              uVar11 = 0xffff;
            }
            pFVar3 = (local_448->super_FResourceFile).Reader;
            (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (pFVar3,(ulong)((((uVar14 + uVar4) - uVar11) + (int)lVar6) - 4),0);
            pFVar3 = (this_00->super_FResourceFile).Reader;
            (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_438,0x16);
            if (((local_430 == local_42e) && (local_432 == 0)) && (local_434 == 0)) {
              (this_00->super_FResourceFile).NumLumps = (uint)local_430;
              puVar7 = (ulong *)operator_new__((ulong)local_430 * 0x60 + 8);
              *puVar7 = (ulong)local_430;
              if (local_430 != 0) {
                lVar6 = 0;
                do {
                  *(undefined8 *)((long)puVar7 + lVar6 + 0x18) = 0x723dac;
                  FString::NullString.RefCount = FString::NullString.RefCount + 1;
                  *(undefined2 *)((long)puVar7 + lVar6 + 0x30) = 0;
                  *(undefined1 *)((long)puVar7 + lVar6 + 0x20) = 0;
                  puVar1 = (undefined8 *)((long)puVar7 + lVar6 + 0x38);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  puVar1 = (undefined8 *)((long)puVar7 + lVar6 + 0x44);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined ***)((long)puVar7 + lVar6 + 8) = &PTR__FResourceLump_007094f8;
                  lVar6 = lVar6 + 0x60;
                } while ((ulong)local_430 * 0x60 != lVar6);
              }
              this_00->Lumps = (FZipLump *)(puVar7 + 1);
              __size = (size_t)local_42c;
              __ptr = malloc(__size);
              pFVar3 = (this_00->super_FResourceFile).Reader;
              uVar14 = 0;
              (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,(ulong)local_428,0);
              pFVar3 = (this_00->super_FResourceFile).Reader;
              (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,__ptr,__size);
              if ((this_00->super_FResourceFile).NumLumps == 0) goto LAB_004d494b;
              this_01 = this_00->Lumps;
              local_458 = (void *)((long)__ptr + __size);
              local_46c = 0;
              uVar4 = 0;
              local_450 = __ptr;
              do {
                uVar2 = *(ushort *)((long)__ptr + 0x1c);
                FString::FString(&local_460,(char *)((long)__ptr + 0x2e),(ulong)uVar2);
                pvVar8 = (void *)((long)__ptr +
                                 (ulong)*(ushort *)((long)__ptr + 0x20) +
                                 (ulong)*(ushort *)((long)__ptr + 0x1e) +
                                 (ulong)*(ushort *)((long)__ptr + 0x1c) + 0x2e);
                if (local_458 < pvVar8) {
                  free(local_450);
                  if (!quiet) {
                    Printf("\x1cG\n%s: Central directory corrupted.",
                           (this_00->super_FResourceFile).Filename);
                  }
                  FString::~FString(&local_460);
                  return false;
                }
                if ((local_460.Chars[(ulong)uVar2 - 1] == '/') &&
                   (*(int *)((long)__ptr + 0x18) == 0)) {
                  local_46c = local_46c + 1;
                }
                else {
                  if ((*(ushort *)((long)__ptr + 10) < 0xf) &&
                     ((0x5143U >> (*(ushort *)((long)__ptr + 10) & 0x1f) & 1) != 0)) {
                    if ((*(byte *)((long)__ptr + 8) & 1) == 0) {
                      FString::ReplaceChars(&local_460,'\\','/');
                      FString::ToLower(&local_460);
                      FString::AttachToOther(&local_440,&local_460);
                      FResourceLump::LumpNameSetup(&this_01->super_FResourceLump,&local_440);
                      FString::~FString(&local_440);
                      (this_01->super_FResourceLump).LumpSize = *(int *)((long)__ptr + 0x18);
                      (this_01->super_FResourceLump).Owner = &this_00->super_FResourceFile;
                      (this_01->super_FResourceLump).Flags = 0x82;
                      (this_01->super_FResourceLump).field_0x4e = *(undefined1 *)((long)__ptr + 10);
                      *(undefined2 *)&(this_01->super_FResourceLump).field_0x4c =
                           *(undefined2 *)((long)__ptr + 8);
                      this_01->CRC32 = *(uint *)((long)__ptr + 0x10);
                      this_01->CompressedSize = *(int *)((long)__ptr + 0x14);
                      this_01->Position = *(int *)((long)__ptr + 0x2a);
                      FResourceLump::CheckEmbedded(&this_01->super_FResourceLump);
                      iVar5 = strcasecmp("dehacked.exe",local_460.Chars);
                      if (iVar5 == 0) {
                        (this_01->super_FResourceLump).field_3.Name[8] = '\0';
                        (this_01->super_FResourceLump).field_3.qwName = 0;
                      }
                      this_01 = this_01 + 1;
                      goto LAB_004d4921;
                    }
                    if (!quiet) {
                      Printf("\x1cK\n%s: \'%s\' is encrypted. Encryption is not supported.\n",
                             (this_00->super_FResourceFile).Filename);
                    }
                  }
                  else if (!quiet) {
                    Printf("\x1cK\n%s: \'%s\' uses an unsupported compression algorithm (#%d).\n",
                           (this_00->super_FResourceFile).Filename);
                  }
                  local_46c = local_46c + 1;
                }
LAB_004d4921:
                FString::~FString(&local_460);
                uVar4 = uVar4 + 1;
                uVar14 = (this_00->super_FResourceFile).NumLumps;
                __ptr = pvVar8;
                if (uVar14 <= uVar4) {
                  uVar14 = uVar14 - local_46c;
                  __ptr = local_450;
LAB_004d494b:
                  (this_00->super_FResourceFile).NumLumps = uVar14;
                  free(__ptr);
                  if ((!quiet) && (batchrun == false)) {
                    Printf("\x1c-, %d lumps\n",(ulong)uVar14);
                  }
                  FResourceFile::PostProcessArchive
                            (&this_00->super_FResourceFile,this_00->Lumps,0x60);
                  return true;
                }
              } while( true );
            }
            if (quiet) {
              return false;
            }
            pcVar13 = (this_00->super_FResourceFile).Filename;
            format = "\x1cG\n%s: Multipart Zip files are not supported.\n";
            goto LAB_004d49b3;
          }
          break;
        }
        lVar6 = lVar6 + -1;
        iVar5 = (int)uVar16;
        uVar9 = iVar5 - 1;
        uVar16 = (ulong)uVar9;
      } while (uVar9 != 0 && 0 < iVar5);
      if (uVar14 <= uVar11) break;
    }
  }
  local_448->Lumps = (FZipLump *)0x0;
  if (!quiet) {
    pcVar13 = (local_448->super_FResourceFile).Filename;
    format = "\x1cG\n%s: ZIP file corrupt!\n";
LAB_004d49b3:
    Printf(format,pcVar13);
  }
  return false;
}

Assistant:

bool FZipFile::Open(bool quiet)
{
	DWORD centraldir = Zip_FindCentralDir(Reader);
	FZipEndOfCentralDirectory info;
	int skipped = 0;

	Lumps = NULL;

	if (centraldir == 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: ZIP file corrupt!\n", Filename);
		return false;
	}

	// Read the central directory info.
	Reader->Seek(centraldir, SEEK_SET);
	Reader->Read(&info, sizeof(FZipEndOfCentralDirectory));

	// No multi-disk zips!
	if (info.NumEntries != info.NumEntriesOnAllDisks ||
		info.FirstDisk != 0 || info.DiskNumber != 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Multipart Zip files are not supported.\n", Filename);
		return false;
	}

	NumLumps = LittleShort(info.NumEntries);
	Lumps = new FZipLump[NumLumps];

	// Load the entire central directory. Too bad that this contains variable length entries...
	int dirsize = LittleLong(info.DirectorySize);
	void *directory = malloc(dirsize);
	Reader->Seek(LittleLong(info.DirectoryOffset), SEEK_SET);
	Reader->Read(directory, dirsize);

	char *dirptr = (char*)directory;
	FZipLump *lump_p = Lumps;
	for (DWORD i = 0; i < NumLumps; i++)
	{
		FZipCentralDirectoryInfo *zip_fh = (FZipCentralDirectoryInfo *)dirptr;

		int len = LittleShort(zip_fh->NameLength);
		FString name(dirptr + sizeof(FZipCentralDirectoryInfo), len);
		dirptr += sizeof(FZipCentralDirectoryInfo) + 
				  LittleShort(zip_fh->NameLength) + 
				  LittleShort(zip_fh->ExtraLength) + 
				  LittleShort(zip_fh->CommentLength);

		if (dirptr > ((char*)directory) + dirsize)	// This directory entry goes beyond the end of the file.
		{
			free(directory);
			if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Central directory corrupted.", Filename);
			return false;
		}
		
		// skip Directories
		if (name[len - 1] == '/' && LittleLong(zip_fh->UncompressedSize) == 0) 
		{
			skipped++;
			continue;
		}

		// Ignore unknown compression formats
		zip_fh->Method = LittleShort(zip_fh->Method);
		if (zip_fh->Method != METHOD_STORED &&
			zip_fh->Method != METHOD_DEFLATE &&
			zip_fh->Method != METHOD_LZMA &&
			zip_fh->Method != METHOD_BZIP2 &&
			zip_fh->Method != METHOD_IMPLODE &&
			zip_fh->Method != METHOD_SHRINK)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' uses an unsupported compression algorithm (#%d).\n", Filename, name.GetChars(), zip_fh->Method);
			skipped++;
			continue;
		}
		// Also ignore encrypted entries
		zip_fh->Flags = LittleShort(zip_fh->Flags);
		if (zip_fh->Flags & ZF_ENCRYPTED)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' is encrypted. Encryption is not supported.\n", Filename, name.GetChars());
			skipped++;
			continue;
		}

		FixPathSeperator(name);
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = LittleLong(zip_fh->UncompressedSize);
		lump_p->Owner = this;
		// The start of the Reader will be determined the first time it is accessed.
		lump_p->Flags = LUMPF_ZIPFILE | LUMPFZIP_NEEDFILESTART;
		lump_p->Method = BYTE(zip_fh->Method);
		lump_p->GPFlags = zip_fh->Flags;
		lump_p->CRC32 = zip_fh->CRC32;
		lump_p->CompressedSize = LittleLong(zip_fh->CompressedSize);
		lump_p->Position = LittleLong(zip_fh->LocalHeaderOffset);
		lump_p->CheckEmbedded();

		// Ignore some very specific names
		if (0 == stricmp("dehacked.exe", name))
		{
			memset(lump_p->Name, 0, sizeof(lump_p->Name));
		}

		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;
	free(directory);

	if (!quiet && !batchrun) Printf(TEXTCOLOR_NORMAL ", %d lumps\n", NumLumps);
	
	PostProcessArchive(&Lumps[0], sizeof(FZipLump));
	return true;
}